

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

ssize_t read_block(int fd,void *buf,size_t nbyte)

{
  ssize_t sVar1;
  size_t total;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    sVar1 = read(fd,buf,nbyte);
    if (sVar1 < 1) break;
    nbyte = nbyte - sVar1;
    buf = (void *)((long)buf + sVar1);
    lVar2 = lVar2 + sVar1;
  }
  if (sVar1 == 0) {
    sVar1 = lVar2;
  }
  return sVar1;
}

Assistant:

ssize_t read_block(int fd, void *buf, size_t nbyte) {
  ssize_t rd;
  size_t total;
  total = 0;
  while ((rd = read(fd, buf, nbyte)) > 0) {
    nbyte -= rd;
    buf = (char *)buf + rd;
    total += rd;
  }
  if (rd < 0) {
    return rd;
  } else {
    return total;
  }
}